

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

string * __thiscall
t_php_generator::php_includes_abi_cxx11_(string *__return_storage_ptr__,t_php_generator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "use Thrift\\Base\\TBase;\nuse Thrift\\Type\\TType;\nuse Thrift\\Type\\TMessageType;\nuse Thrift\\Exception\\TException;\nuse Thrift\\Exception\\TProtocolException;\nuse Thrift\\Protocol\\TProtocol;\nuse Thrift\\Protocol\\TBinaryProtocolAccelerated;\nuse Thrift\\Exception\\TApplicationException;\n"
             ,"");
  if (this->json_serializable_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::php_includes() {
  string includes = "use Thrift\\Base\\TBase;\n"
                    "use Thrift\\Type\\TType;\n"
                    "use Thrift\\Type\\TMessageType;\n"
                    "use Thrift\\Exception\\TException;\n"
                    "use Thrift\\Exception\\TProtocolException;\n"
                    "use Thrift\\Protocol\\TProtocol;\n"
                    "use Thrift\\Protocol\\TBinaryProtocolAccelerated;\n"
                    "use Thrift\\Exception\\TApplicationException;\n";

  if (json_serializable_) {
    includes += "use JsonSerializable;\n"
                "use stdClass;\n";
  }

  return includes;
}